

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::JavascriptProxy::GetItemQuery
          (JavascriptProxy *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  Type *this_00;
  ImplicitCallFlags IVar1;
  PropertyId propertyId;
  ScriptContext *scriptContext;
  ThreadContext *this_01;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  Attributes attributes;
  Type TVar6;
  Var pvVar7;
  RecyclableObject *pRVar8;
  JavascriptFunction *pJVar9;
  Var pvVar10;
  JavascriptMethod p_Var11;
  JavascriptFunction *pJVar12;
  undefined4 *puVar13;
  PropertyDescriptor *this_02;
  PropertyDescriptor local_100;
  PropertyRecord *local_d0;
  PropertyRecord *propertyRecord;
  PropertyDescriptor result;
  char local_75;
  char local_74;
  char local_73;
  RecyclableObject *local_40;
  
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&propertyRecord);
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  BVar5 = 0;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  this_01 = requestContext->threadContext;
  if ((this_01->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    BVar5 = 0;
    pvVar7 = CrossSite::MarshalVar(requestContext,(this->handler).ptr,false);
    if (pvVar7 == (Var)0x0) {
      bVar3 = ThreadContext::RecordImplicitException(this_01);
      if (bVar3) {
        JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"get");
      }
    }
    else {
      pRVar8 = (RecyclableObject *)CrossSite::MarshalVar(requestContext,(this->target).ptr,false);
      pJVar9 = GetMethodHelper(this,0x198,requestContext);
      if ((pJVar9 == (JavascriptFunction *)0x0) ||
         (bVar3 = Memory::Recycler::IsHeapEnumInProgress(requestContext->recycler), bVar3)) {
        result.enumerableSpecified = false;
        BVar5 = JavascriptOperators::GetItem(originalInstance,pRVar8,index,value,requestContext);
      }
      else {
        PropertyIdFromInt(this,index,&local_d0);
        propertyId = local_d0->pid;
        result.enumerableSpecified = true;
        pvVar10 = GetName(requestContext,propertyId);
        bVar3 = this_01->reentrancySafeOrHandled;
        this_01->reentrancySafeOrHandled = true;
        attributes = FunctionInfo::GetAttributes((RecyclableObject *)pJVar9);
        bVar4 = ThreadContext::HasNoSideEffect(this_01,(RecyclableObject *)pJVar9,attributes);
        if (bVar4) {
          ThreadContext::CheckAndResetReentrancySafeOrHandled(this_01);
          if (this_01->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar9);
          CheckIsExecutable((RecyclableObject *)pJVar9,p_Var11);
          p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar9);
          local_40 = (RecyclableObject *)
                     (*p_Var11)((RecyclableObject *)pJVar9,(CallInfo)pJVar9,0x2000004,0,0,0,0,
                                0x2000004,pvVar7,pRVar8,pvVar10,originalInstance);
          bVar4 = ThreadContext::IsOnStack(local_40);
LAB_00d09dba:
          if (bVar4 != false) {
            this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_Accessor;
          }
        }
        else if ((this_01->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag)
        {
          if ((attributes & HasNoSideEffect) != None) {
            ThreadContext::CheckAndResetReentrancySafeOrHandled(this_01);
            if (this_01->noJsReentrancy == true) {
              Throw::FatalJsReentrancyError();
            }
            p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar9);
            CheckIsExecutable((RecyclableObject *)pJVar9,p_Var11);
            p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar9);
            local_40 = (RecyclableObject *)
                       (*p_Var11)((RecyclableObject *)pJVar9,(CallInfo)pJVar9,0x2000004,0,0,0,0,
                                  0x2000004,pvVar7,pRVar8,pvVar10,originalInstance);
            bVar4 = ThreadContext::IsOnStack(local_40);
            goto LAB_00d09dba;
          }
          IVar1 = this_01->implicitCallFlags;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(this_01);
          if (this_01->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar9);
          CheckIsExecutable((RecyclableObject *)pJVar9,p_Var11);
          p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar9);
          local_40 = (RecyclableObject *)
                     (*p_Var11)((RecyclableObject *)pJVar9,(CallInfo)pJVar9,0x2000004,0,0,0,0,
                                0x2000004,pvVar7,pRVar8,pvVar10,originalInstance);
          this_01->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
        }
        else {
          this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_Accessor;
          local_40 = (((((((((pJVar9->super_DynamicObject).super_RecyclableObject.type.ptr)->
                           javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
                       ->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                     undefinedValue.ptr;
        }
        this_01->reentrancySafeOrHandled = bVar3;
        this_00 = &result.Configurable;
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)this_00);
        pJVar9 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).defaultAccessorFunction.ptr;
        BVar5 = JavascriptOperators::GetOwnPropertyDescriptor
                          (pRVar8,propertyId,requestContext,(PropertyDescriptor *)this_00);
        if (BVar5 != 0) {
          JavascriptOperators::CompletePropertyDescriptor
                    ((PropertyDescriptor *)this_00,(PropertyDescriptor *)0x0,requestContext);
          if (((local_75 != '\x01') ||
              (bVar3 = PropertyDescriptor::IsConfigurable
                                 ((PropertyDescriptor *)&result.Configurable), bVar3)) ||
             (bVar3 = PropertyDescriptor::IsWritable((PropertyDescriptor *)&result.Configurable),
             bVar3)) {
            if (((local_74 != '\0') || (local_73 == '\x01')) &&
               ((bVar3 = PropertyDescriptor::IsConfigurable
                                   ((PropertyDescriptor *)&result.Configurable), !bVar3 &&
                (pJVar12 = (JavascriptFunction *)
                           PropertyDescriptor::GetGetter((PropertyDescriptor *)&result.Configurable)
                , pJVar12 == pJVar9)))) {
              if (local_40 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                *puVar13 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
                if (!bVar3) goto LAB_00d0a1d1;
                *puVar13 = 0;
              }
              bVar3 = TaggedInt::Is(local_40);
              if ((ulong)local_40 >> 0x32 != 0 || bVar3) {
LAB_00d0a091:
                TVar6 = TypeIds_FirstNumberType;
              }
              else {
                pRVar8 = UnsafeVarTo<Js::RecyclableObject>(local_40);
                if (pRVar8 == (RecyclableObject *)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                  *puVar13 = 1;
                  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                              ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                  if (!bVar3) goto LAB_00d0a1d1;
                  *puVar13 = 0;
                }
                TVar6 = ((pRVar8->type).ptr)->typeId;
                if (0x57 < (int)TVar6) {
                  BVar5 = RecyclableObject::IsExternal(pRVar8);
                  if (BVar5 == 0) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                    *puVar13 = 1;
                    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())"
                                                ,"GetTypeId aValue has invalid TypeId");
                    if (!bVar3) {
LAB_00d0a1d1:
                      pcVar2 = (code *)invalidInstructionException();
                      (*pcVar2)();
                    }
                    *puVar13 = 0;
                  }
                  goto LAB_00d0a091;
                }
              }
              if (TVar6 != TypeIds_Undefined) {
LAB_00d0a1bd:
                JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"get");
              }
            }
          }
          else {
            bVar3 = JavascriptConversion::SameValueCommon<false>(local_40,(Var)result._40_8_);
            if (!bVar3) goto LAB_00d0a1bd;
          }
        }
        PropertyDescriptor::SetValue((PropertyDescriptor *)&propertyRecord,local_40);
        this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_External;
        BVar5 = 1;
      }
    }
  }
  else {
    this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_External;
  }
  if (BVar5 == 0) {
    pRVar8 = ScriptContext::GetMissingItemResult(requestContext);
  }
  else {
    if (result.enumerableSpecified != true) goto LAB_00d0a194;
    this_02 = &local_100;
    PropertyDescriptor::PropertyDescriptor(&local_100,(PropertyDescriptor *)&propertyRecord);
    pRVar8 = (RecyclableObject *)
             GetValueFromDescriptor
                       ((JavascriptProxy *)this_02,originalInstance,&local_100,requestContext);
  }
  *value = pRVar8;
LAB_00d0a194:
  return (PropertyQueryFlags)(BVar5 != 0);
}

Assistant:

PropertyQueryFlags JavascriptProxy::GetItemQuery(Var originalInstance, uint32 index, Var* value, ScriptContext * requestContext)
    {
        const PropertyRecord* propertyRecord;
        auto fn = [&](RecyclableObject* object)-> BOOL {
            return JavascriptOperators::GetItem(originalInstance, object, index, value, requestContext);
        };
        auto getPropertyId = [&]() ->PropertyId {
            PropertyIdFromInt(index, &propertyRecord);
            return propertyRecord->GetPropertyId();
        };
        PropertyDescriptor result;
        BOOL foundProperty = GetPropertyTrap(originalInstance, &result, fn, getPropertyId, requestContext);
        if (!foundProperty)
        {
            *value = requestContext->GetMissingItemResult();
        }
        else if (result.IsFromProxy())
        {
            *value = GetValueFromDescriptor(originalInstance, result, requestContext);
        }
        return JavascriptConversion::BooleanToPropertyQueryFlags(foundProperty);
    }